

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialog::setOptions(QFileDialog *this,Options options)

{
  QFileDialogPrivate *this_00;
  QFlagsStorageHelper<QFileDialog::Option,_4> QVar1;
  uint uVar2;
  Filters FVar3;
  long *plVar4;
  uint uVar5;
  QFileDialogPrivate *d;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QVar1.super_QFlagsStorage<QFileDialog::Option>.i =
       (QFlagsStorage<QFileDialog::Option>)QFileDialogOptions::options();
  if (QVar1.super_QFlagsStorage<QFileDialog::Option>.i !=
      (QFlagsStorage<QFileDialog::Option>)
      options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
      super_QFlagsStorage<QFileDialog::Option>.i) {
    QFileDialogOptions::setOptions
              ((this_00->options).value.ptr,
               options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
               super_QFlagsStorage<QFileDialog::Option>.i);
    if (((uint)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
               super_QFlagsStorage<QFileDialog::Option>.i & 8) != 0) {
      (this_00->super_QDialogPrivate).nativeDialogInUse = false;
      QFileDialogPrivate::createWidgets(this_00);
    }
    uVar5 = (uint)QVar1.super_QFlagsStorage<QFileDialog::Option>.i ^
            (uint)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                  super_QFlagsStorage<QFileDialog::Option>.i;
    if (((this_00->super_QDialogPrivate).nativeDialogInUse == false) &&
       ((this_00->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
      if ((uVar5 & 2) != 0) {
        QFileSystemModel::setResolveSymlinks(SUB81(this_00->model,0));
      }
      if ((uVar5 & 0x10) != 0) {
        QFileSystemModel::setReadOnly(SUB81(this_00->model,0));
        QWidget::setEnabled((QWidget *)((this_00->qFileDialogUi).d)->newFolderButton,
                            ((uint)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                                   super_QFlagsStorage<QFileDialog::Option>.i & 0x10) == 0);
        QAction::setEnabled(SUB81(this_00->renameAction,0));
        QAction::setEnabled(SUB81(this_00->deleteAction,0));
      }
      if ((uVar5 & 0x40) != 0) {
        plVar4 = (long *)QFileSystemModel::iconProvider();
        uVar2 = (**(code **)(*plVar4 + 0x30))(plVar4);
        plVar4 = (long *)QFileSystemModel::iconProvider();
        (**(code **)(*plVar4 + 0x28))
                  (plVar4,(uint)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                                super_QFlagsStorage<QFileDialog::Option>.i >> 6 & 1 |
                          uVar2 & 0xfffffffe);
      }
    }
    if ((uVar5 & 0x20) != 0) {
      QFileDialogOptions::nameFilters();
      setNameFilters(this,(QStringList *)&QStack_48);
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_48);
    }
    if ((uVar5 & 1) != 0) {
      FVar3 = filter(this);
      setFilter(this,(Filters)(((uint)FVar3.super_QFlagsStorageHelper<QDir::Filter,_4>.
                                      super_QFlagsStorage<QDir::Filter>.i & 0xfffffffd) +
                               ((uint)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                                      super_QFlagsStorage<QFileDialog::Option>.i & 1) * 2 ^ 2));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setOptions(Options options)
{
    Q_D(QFileDialog);

    Options changed = (options ^ QFileDialog::options());
    if (!changed)
        return;

    d->options->setOptions(QFileDialogOptions::FileDialogOptions(int(options)));

    if (options & DontUseNativeDialog) {
        d->nativeDialogInUse = false;
        d->createWidgets();
    }

    if (d->usingWidgets()) {
        if (changed & DontResolveSymlinks)
            d->model->setResolveSymlinks(!(options & DontResolveSymlinks));
        if (changed & ReadOnly) {
            bool ro = (options & ReadOnly);
            d->model->setReadOnly(ro);
            d->qFileDialogUi->newFolderButton->setEnabled(!ro);
            d->renameAction->setEnabled(!ro);
            d->deleteAction->setEnabled(!ro);
        }

        if (changed & DontUseCustomDirectoryIcons) {
            QFileIconProvider::Options providerOptions = iconProvider()->options();
            providerOptions.setFlag(QFileIconProvider::DontUseCustomDirectoryIcons,
                                    options & DontUseCustomDirectoryIcons);
            iconProvider()->setOptions(providerOptions);
        }
    }

    if (changed & HideNameFilterDetails)
        setNameFilters(d->options->nameFilters());

    if (changed & ShowDirsOnly)
        setFilter((options & ShowDirsOnly) ? filter() & ~QDir::Files : filter() | QDir::Files);
}